

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O3

void __thiscall
QPDFArgParser::addOptionHelp
          (QPDFArgParser *this,string *option_name,string *topic,string *short_text,
          string *long_text)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  char *pcVar3;
  element_type *peVar4;
  const_iterator cVar5;
  iterator iVar6;
  mapped_type *this_00;
  mapped_type *pmVar7;
  logic_error *plVar8;
  long *plVar9;
  size_type *psVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [32];
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (((option_name->_M_string_length < 3) ||
      (pcVar3 = (option_name->_M_dataplus)._M_p, *pcVar3 != '-')) || (pcVar3[1] != '-')) {
    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar8,"QPDFArgParser: options for help must start with --");
    __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  peVar4 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
          ::find(&(peVar4->option_help)._M_t,option_name);
  if (cVar5._M_node != &(peVar4->option_help)._M_t._M_impl.super__Rb_tree_header._M_header) {
    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_e0,"QPDFArgParser: option ",option_name);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e0);
    local_c0._0_8_ = *plVar9;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_c0._0_8_ == psVar10) {
      local_c0._16_8_ = *psVar10;
      local_c0._24_8_ = plVar9[3];
      local_c0._0_8_ = local_c0 + 0x10;
    }
    else {
      local_c0._16_8_ = *psVar10;
    }
    local_c0._8_8_ = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::logic_error::logic_error(plVar8,(string *)local_c0);
    __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
          ::find(&(((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->help_topics)._M_t,topic);
  if (iVar6._M_node !=
      &(((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       help_topics)._M_t._M_impl.super__Rb_tree_header._M_header) {
    HelpTopic::HelpTopic((HelpTopic *)local_c0,short_text,long_text);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
              ::operator[](&((this->m).
                             super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->option_help,option_name);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_c0);
    std::__cxx11::string::operator=((string *)&this_00->long_text,(string *)&local_a0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this_00->options)._M_t);
    if (local_80._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &local_80._M_impl.super__Rb_tree_header;
      (this_00->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_80._M_impl.super__Rb_tree_header._M_header._M_color;
      (this_00->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
      (this_00->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_80._M_impl.super__Rb_tree_header._M_header._M_left;
      (this_00->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_80._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_80._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(this_00->options)._M_t._M_impl.super__Rb_tree_header._M_header;
      (this_00->options)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_80._M_impl.super__Rb_tree_header._M_node_count;
      local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_80._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_80._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_p != &local_90) {
      operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
    }
    pcVar2 = local_c0 + 0x10;
    if ((pointer)local_c0._0_8_ != pcVar2) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)(iVar6._M_node + 4),option_name);
    peVar4 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_c0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"help","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
             ::operator[](&peVar4->help_option_table,(key_type *)local_c0);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&pmVar7->choices,option_name);
    if ((pointer)local_c0._0_8_ != pcVar2) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    return;
  }
  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"QPDFArgParser: unable to add option ",option_name);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_e0._M_dataplus._M_p = (pointer)*plVar9;
  psVar10 = (size_type *)(plVar9 + 2);
  if ((size_type *)local_e0._M_dataplus._M_p == psVar10) {
    local_e0.field_2._M_allocated_capacity = *psVar10;
    local_e0.field_2._8_8_ = plVar9[3];
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar10;
  }
  local_e0._M_string_length = plVar9[1];
  *plVar9 = (long)psVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                 &local_e0,topic);
  std::logic_error::logic_error(plVar8,(string *)local_c0);
  __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDFArgParser::addOptionHelp(
    std::string const& option_name,
    std::string const& topic,
    std::string const& short_text,
    std::string const& long_text)
{
    if (!((option_name.length() > 2) && (option_name.at(0) == '-') && (option_name.at(1) == '-'))) {
        QTC::TC("libtests", "QPDFArgParser bad option for help");
        throw std::logic_error("QPDFArgParser: options for help must start with --");
    }
    if (m->option_help.count(option_name)) {
        QTC::TC("libtests", "QPDFArgParser duplicate option help");
        throw std::logic_error("QPDFArgParser: option " + option_name + " already has help");
    }
    auto ht = m->help_topics.find(topic);
    if (ht == m->help_topics.end()) {
        QTC::TC("libtests", "QPDFArgParser add to unknown topic");
        throw std::logic_error(
            "QPDFArgParser: unable to add option " + option_name + " to unknown help topic " +
            topic);
    }
    m->option_help[option_name] = HelpTopic(short_text, long_text);
    ht->second.options.insert(option_name);
    m->help_option_table["help"].choices.insert(option_name);
}